

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stoch.c
# Opt level: O0

TA_RetCode
referenceStoch(TA_Integer startIdx,TA_Integer endIdx,TA_Real *inHigh,TA_Real *inLow,TA_Real *inClose
              ,TA_Integer optInPeriod_0,TA_Integer optInPeriod_1,TA_Integer optInMAType_1,
              TA_Integer optInPeriod_2,TA_Integer optInMAType_2,TA_Integer *outBegIdx,
              TA_Integer *outNbElement,TA_Real *outSlowK_0,TA_Real *outSlowD_1)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TA_MAType TVar5;
  double *inReal;
  double *in_RCX;
  double *in_RDX;
  int in_ESI;
  TA_MAType in_EDI;
  double *in_R8;
  uint in_R9D;
  int bufferIsAllocated;
  int i;
  int today;
  int trailingIdx;
  int lookbackDSlow;
  int lookbackKSlow;
  int lookbackK;
  int lookbackTotal;
  int outIdx;
  double *tempBuffer;
  double tmp;
  double Ht;
  double Lt;
  TA_RetCode retCode;
  undefined8 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int local_70;
  int local_6c;
  int local_68;
  int optInTimePeriod;
  double in_stack_ffffffffffffffb8;
  int endIdx_00;
  int startIdx_00;
  double in_stack_ffffffffffffffc0;
  double local_38;
  undefined4 in_stack_ffffffffffffffd0;
  TA_MAType local_8;
  TA_RetCode local_4;
  
  iVar2 = in_R9D - 1;
  TVar5 = (TA_MAType)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  iVar3 = TA_MA_Lookback(in_stack_ffffffffffffff80,TVar5);
  iVar4 = TA_MA_Lookback(in_stack_ffffffffffffff80,TVar5);
  TVar5 = iVar2 + iVar4 + iVar3;
  local_8 = in_EDI;
  if ((int)in_EDI < (int)TVar5) {
    local_8 = TVar5;
  }
  if (in_ESI < (int)local_8) {
    *_lookbackKSlow = TA_MAType_SMA;
    *_lookbackTotal = 0;
    local_4 = TA_SUCCESS;
  }
  else {
    optInTimePeriod = 0;
    local_68 = local_8 - TVar5;
    local_6c = local_68 + iVar2;
    bVar1 = false;
    inReal = tempBuffer;
    if (((((tempBuffer != in_RDX) && (tempBuffer != in_RCX)) && (tempBuffer != in_R8)) &&
        ((inReal = (double *)tmp, (double *)tmp != in_RDX && ((double *)tmp != in_RCX)))) &&
       ((double *)tmp != in_R8)) {
      bVar1 = true;
      inReal = (double *)malloc((long)((in_ESI - local_6c) + 1) << 3);
    }
    while( true ) {
      startIdx_00 = SUB84(in_stack_ffffffffffffffc0,0);
      endIdx_00 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      if (in_ESI < local_6c) break;
      local_38 = in_RCX[local_68];
      in_stack_ffffffffffffffc0 = in_RDX[local_68];
      local_68 = local_68 + 1;
      for (local_70 = local_68; local_70 <= local_6c; local_70 = local_70 + 1) {
        if (in_RCX[local_70] < local_38) {
          local_38 = in_RCX[local_70];
        }
        if (in_stack_ffffffffffffffc0 < in_RDX[local_70]) {
          in_stack_ffffffffffffffc0 = in_RDX[local_70];
        }
      }
      in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffc0 - local_38;
      if (in_stack_ffffffffffffffb8 <= 0.0) {
        inReal[optInTimePeriod] = 100.0;
      }
      else {
        inReal[optInTimePeriod] = ((in_R8[local_6c] - local_38) / in_stack_ffffffffffffffb8) * 100.0
        ;
      }
      optInTimePeriod = optInTimePeriod + 1;
      local_6c = local_6c + 1;
    }
    local_4 = TA_MA(startIdx_00,endIdx_00,inReal,optInTimePeriod,TVar5,(int *)CONCAT44(iVar2,iVar3),
                    (int *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_R8);
    if ((local_4 == TA_SUCCESS) && (*_lookbackTotal != 0)) {
      local_4 = TA_MA(startIdx_00,endIdx_00,inReal,optInTimePeriod,TVar5,
                      (int *)CONCAT44(iVar2,iVar3),(int *)((ulong)in_R9D << 0x20),in_R8);
      memmove(tempBuffer,inReal + iVar4,(long)*_lookbackTotal << 3);
      if (bVar1) {
        free(inReal);
      }
      if (local_4 == TA_SUCCESS) {
        *_lookbackKSlow = local_8;
        local_4 = TA_SUCCESS;
      }
      else {
        *_lookbackKSlow = TA_MAType_SMA;
        *_lookbackTotal = 0;
      }
    }
    else {
      if (bVar1) {
        free(inReal);
      }
      *_lookbackKSlow = TA_MAType_SMA;
      *_lookbackTotal = 0;
    }
  }
  return local_4;
}

Assistant:

static TA_RetCode referenceStoch( TA_Integer    startIdx,
                     TA_Integer    endIdx,
                     const TA_Real inHigh[],
                     const TA_Real inLow[],
                     const TA_Real inClose[],
                     TA_Integer    optInPeriod_0, /* From 1 to TA_INTEGER_MAX */
                     TA_Integer    optInPeriod_1, /* From 1 to TA_INTEGER_MAX */
                     TA_Integer    optInMAType_1,
                     TA_Integer    optInPeriod_2, /* From 1 to TA_INTEGER_MAX */
                     TA_Integer    optInMAType_2,
                     TA_Integer   *outBegIdx,
                     TA_Integer   *outNbElement,
                     TA_Real       outSlowK_0[],
                     TA_Real       outSlowD_1[] )
{
   TA_RetCode retCode;
   double Lt, Ht, tmp, *tempBuffer;
   int outIdx;
   int lookbackTotal, lookbackK, lookbackKSlow, lookbackDSlow;
   int trailingIdx, today, i, bufferIsAllocated;

   /* Identify the lookback needed. */
   lookbackK      = optInPeriod_0-1;
   lookbackKSlow  = TA_MA_Lookback( optInPeriod_1, (TA_MAType)optInMAType_1 );
   lookbackDSlow  = TA_MA_Lookback( optInPeriod_2, (TA_MAType)optInMAType_2 );
   lookbackTotal  = lookbackK + lookbackDSlow + lookbackKSlow;

   /* Move up the start index if there is not
    * enough initial data.
    */
   if( startIdx < lookbackTotal )
      startIdx = lookbackTotal;

   /* Make sure there is still something to evaluate. */
   if( startIdx > endIdx )
   {
      /* Succeed... but no data in the output. */
      *outBegIdx    = 0;
      *outNbElement = 0;
      return TA_SUCCESS;
   }

   /* Do the K calculation:
    *
    *    Kt = 100 x ((Ct-Lt)/(Ht-Lt))
    *
    * Kt is today stochastic
    * Ct is today closing price.
    * Lt is the lowest price of the last K Period (including today)
    * Ht is the highest price of the last K Period (including today)
    */

   /* Proceed with the calculation for the requested range.
    * Note that this algorithm allows the input and
    * output to be the same buffer.
    */
   outIdx = 0;

   /* Calculate just enough K for ending up with the caller
    * requested range. (The range of k must consider all
    * the lookback involve with the smoothing).
    */
   trailingIdx = startIdx-lookbackTotal;
   today       = trailingIdx+lookbackK;

   /* Allocate a temporary buffer large enough to
    * store the K.
    *
    * If the output is the same as the input, great
    * we just save ourself one memory allocation.
    */
   bufferIsAllocated = 0;
   if( (outSlowK_0 == inHigh) ||
       (outSlowK_0 == inLow)  ||
       (outSlowK_0 == inClose) )
   {
      tempBuffer = outSlowK_0;
   }
   else if( (outSlowD_1 == inHigh) ||
            (outSlowD_1 == inLow)  ||
            (outSlowD_1 == inClose) )
   {
      tempBuffer = outSlowD_1;
   }
   else
   {
      bufferIsAllocated = 1;
      tempBuffer = TA_Malloc( (endIdx-today+1)*sizeof(TA_Real) );
   }

   /* Do the K calculation */
   while( today <= endIdx )
   {
      /* Find Lt and Ht for the requested K period. */
      Lt = inLow [trailingIdx];
      Ht = inHigh[trailingIdx];
      trailingIdx++;
      for( i=trailingIdx; i <= today; i++ )
      {
         tmp = inLow[i];
         if( tmp < Lt ) Lt = tmp;
         tmp = inHigh[i];
         if( tmp > Ht ) Ht = tmp;
      }

      /* Calculate stochastic. */
      tmp = Ht-Lt;
      if( tmp > 0.0 )
        tempBuffer[outIdx++] = 100.0*((inClose[today]-Lt)/tmp);
      else
        tempBuffer[outIdx++] = 100.0;

      today++;
   }

   /* Un-smoothed K calculation completed. This K calculation is not returned
    * to the caller. It is always smoothed and then return.
    * Some documentation will refer to the smoothed version as being
    * "K-Slow", but often this end up to be shorten to "K".
    */
   retCode = TA_MA( 0, outIdx-1,
                    tempBuffer, optInPeriod_1,
                    (TA_MAType)optInMAType_1,
                    outBegIdx, outNbElement, tempBuffer );


   if( (retCode != TA_SUCCESS) || (*outNbElement == 0) )
   {
      if( bufferIsAllocated )
        TA_Free(  tempBuffer );
      /* Something wrong happen? No further data? */
      *outBegIdx    = 0;
      *outNbElement = 0;
      return retCode;
   }

   /* Calculate the %D which is simply a moving average of
    * the already smoothed %K.
    */
   retCode = TA_MA( 0, (*outNbElement)-1,
                    tempBuffer, optInPeriod_2,
                    (TA_MAType)optInMAType_2,
                    outBegIdx, outNbElement, outSlowD_1 );

   /* Copy tempBuffer into the caller buffer.
    * (Calculation could not be done directly in the
    *  caller buffer because more input data then the
    *  requested range was needed for doing %D).
    */
   memmove( outSlowK_0, &tempBuffer[lookbackDSlow], (*outNbElement) * sizeof(TA_Real) );

   /* Don't need K anymore, free it if it was allocated here. */
   if( bufferIsAllocated )
      TA_Free(  tempBuffer );

   if( retCode != TA_SUCCESS )
   {
      /* Something wrong happen while processing %D? */
      *outBegIdx    = 0;
      *outNbElement = 0;
      return retCode;
   }

   /* Note: Keep the outBegIdx relative to the
    *       caller input before returning.
    */
   *outBegIdx = startIdx;

   return TA_SUCCESS;
}